

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

void Cut_CellPrecompute(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Cut_CMan_t *p_00;
  Cut_Cell_t *pCVar5;
  abctime aVar6;
  abctime clk;
  uint local_38;
  int c;
  int k;
  int j;
  int i;
  int i3;
  int i2;
  int i1;
  Cut_Cell_t *pTemp;
  Cut_Cell_t *pCell;
  Cut_CMan_t *p;
  
  aVar4 = Abc_Clock();
  p_00 = Cut_CManStart();
  for (k = 0; k < 0x16; k = k + 1) {
    Cut_CellTruthElem(p_00->uInputs[0],p_00->uInputs[1],p_00->uInputs[2],p_00->uTemp1[k],9,k);
  }
  for (k = 0; k < 0x16; k = k + 1) {
    Cut_CellTruthElem(p_00->uInputs[3],p_00->uInputs[4],p_00->uInputs[5],p_00->uTemp2[k],9,k);
  }
  for (k = 0; k < 0x16; k = k + 1) {
    Cut_CellTruthElem(p_00->uInputs[6],p_00->uInputs[7],p_00->uInputs[8],p_00->uTemp3[k],9,k);
  }
  local_38 = 0;
  do {
    if (9 < (int)local_38) {
      printf("BASIC: Total = %d. Good = %d. Entry = %d. ",(ulong)(uint)p_00->nTotal,
             (ulong)(uint)p_00->nGood,0x98);
      Abc_Print(1,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
      printf("Cells:  ");
      for (k = 0; k < 10; k = k + 1) {
        printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nVarCounts[k]);
      }
      printf("\nDiffs:  ");
      for (k = 0; k < 10; k = k + 1) {
        printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nSymGroups[k]);
      }
      printf("\nEquals: ");
      for (k = 0; k < 10; k = k + 1) {
        printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nSymGroupsE[k]);
      }
      printf("\n");
      local_38 = 9;
      do {
        if ((int)local_38 < 4) {
          Abc_Print(1,"%s =","Supp ");
          Abc_Print(1,"%9.2f sec\n",((double)p_00->timeSupp * 1.0) / 1000000.0);
          Abc_Print(1,"%s =","Canon");
          Abc_Print(1,"%9.2f sec\n",((double)p_00->timeCanon * 1.0) / 1000000.0);
          Abc_Print(1,"%s =","Table");
          Abc_Print(1,"%9.2f sec\n",((double)p_00->timeTable * 1.0) / 1000000.0);
          return;
        }
        for (_i2 = p_00->pSameVar[(int)local_38]; _i2 != (Cut_Cell_t *)0x0; _i2 = _i2->pNextVar) {
          for (i3 = 0; i = i3, i3 < (int)local_38; i3 = i3 + 1) {
            while (i = i + 1, i < (int)local_38) {
              for (clk._4_4_ = 0; (int)clk._4_4_ < 3; clk._4_4_ = clk._4_4_ + 1) {
                pCVar5 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p_00->pMem);
                memset(pCVar5,0,0x98);
                *(uint *)&pCVar5->field_0x20 =
                     *(uint *)&pCVar5->field_0x20 & 0xfffffff0 | *(uint *)&_i2->field_0x20 & 0xf;
                pCVar5->pParent = _i2;
                for (k = 0; k < (int)(*(uint *)&pCVar5->field_0x20 & 0xf); k = k + 1) {
                  pCVar5->CanonPerm[k] = (char)k;
                }
                Extra_TruthCopy(pCVar5->uTruth,_i2->uTruth,*(uint *)&_i2->field_0x20 & 0xf);
                *(uint *)&pCVar5->field_0x20 =
                     *(uint *)&pCVar5->field_0x20 & 0xffffff0f | (i3 & 0xfU) << 4;
                *(uint *)&pCVar5->field_0x20 =
                     *(uint *)&pCVar5->field_0x20 & 0xfffff0ff | (i & 0xfU) << 8;
                *(uint *)&pCVar5->field_0x20 =
                     *(uint *)&pCVar5->field_0x20 & 0xffffcfff | (clk._4_4_ & 3) << 0xc;
                Cut_CellCrossBar(pCVar5);
                Cut_CellSuppMin(pCVar5);
                uVar2 = Extra_TruthSemiCanonicize
                                  (pCVar5->uTruth,p_00->puAux,*(uint *)&pCVar5->field_0x20 & 0xf,
                                   pCVar5->CanonPerm,pCVar5->Store);
                *(uint *)&pCVar5->field_0x20 = *(uint *)&pCVar5->field_0x20 & 0x3fff | uVar2 << 0xe;
                p_00->nTotal = p_00->nTotal + 1;
                iVar3 = Cut_CellTableLookup(p_00,pCVar5);
                if (iVar3 == 0) {
                  p_00->nGood = p_00->nGood + 1;
                  uVar2 = *(uint *)&pCVar5->field_0x20 & 0xf;
                  p_00->nVarCounts[uVar2] = p_00->nVarCounts[uVar2] + 1;
                  for (k = 0; k < (int)((*(uint *)&pCVar5->field_0x20 & 0xf) - 1); k = k + 1) {
                    iVar3 = k;
                    if (pCVar5->Store[k << 1] == pCVar5->Store[(k + 1) * 2]) {
                      do {
                        iVar1 = iVar3;
                        c = iVar1 + 1;
                        if ((int)(*(uint *)&pCVar5->field_0x20 & 0xf) <= c) break;
                        iVar3 = c;
                      } while (pCVar5->Store[k << 1] == pCVar5->Store[c * 2]);
                      if (pCVar5->Store[k << 1] == pCVar5->Store[k * 2 + 1]) {
                        p_00->nSymGroupsE[c - k] = p_00->nSymGroupsE[c - k] + 1;
                        k = iVar1;
                      }
                      else {
                        p_00->nSymGroups[c - k] = p_00->nSymGroups[c - k] + 1;
                        k = iVar1;
                      }
                    }
                  }
                }
                else {
                  Extra_MmFixedEntryRecycle(p_00->pMem,(char *)pCVar5);
                }
              }
            }
          }
        }
        printf("VAR %d: Total = %d. Good = %d. Entry = %d. ",(ulong)local_38,
               (ulong)(uint)p_00->nTotal,(ulong)(uint)p_00->nGood,0x98);
        Abc_Print(1,"%s =","Time");
        aVar6 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
        printf("Cells:  ");
        for (k = 0; k < 10; k = k + 1) {
          printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nVarCounts[k]);
        }
        printf("\nDiffs:  ");
        for (k = 0; k < 10; k = k + 1) {
          printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nSymGroups[k]);
        }
        printf("\nEquals: ");
        for (k = 0; k < 10; k = k + 1) {
          printf("%d=%d ",(ulong)(uint)k,(ulong)(uint)p_00->nSymGroupsE[k]);
        }
        printf("\n");
        local_38 = local_38 - 1;
      } while( true );
    }
    for (i3 = 0; i3 < 0x16; i3 = i3 + 1) {
      for (i = 0; i < 0x16; i = i + 1) {
        for (j = 0; j < 0x16; j = j + 1) {
          pCVar5 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p_00->pMem);
          memset(pCVar5,0,0x98);
          *(uint *)&pCVar5->field_0x20 = *(uint *)&pCVar5->field_0x20 & 0xfffffff0 | 9;
          pCVar5->Box[0] = (char)s_NPNe3[(int)local_38];
          pCVar5->Box[1] = (char)i3;
          pCVar5->Box[2] = (char)i;
          pCVar5->Box[3] = (char)j;
          for (k = 0; k < (int)(*(uint *)&pCVar5->field_0x20 & 0xf); k = k + 1) {
            pCVar5->CanonPerm[k] = (char)k;
          }
          Cut_CellTruthElem(p_00->uTemp1[i3],p_00->uTemp2[i],p_00->uTemp3[j],pCVar5->uTruth,9,
                            s_NPNe3[(int)local_38]);
          Cut_CellSuppMin(pCVar5);
          uVar2 = Extra_TruthSemiCanonicize
                            (pCVar5->uTruth,p_00->puAux,*(uint *)&pCVar5->field_0x20 & 0xf,
                             pCVar5->CanonPerm,pCVar5->Store);
          *(uint *)&pCVar5->field_0x20 = *(uint *)&pCVar5->field_0x20 & 0x3fff | uVar2 << 0xe;
          p_00->nTotal = p_00->nTotal + 1;
          iVar3 = Cut_CellTableLookup(p_00,pCVar5);
          if (iVar3 == 0) {
            p_00->nGood = p_00->nGood + 1;
            uVar2 = *(uint *)&pCVar5->field_0x20 & 0xf;
            p_00->nVarCounts[uVar2] = p_00->nVarCounts[uVar2] + 1;
            if ((*(uint *)&pCVar5->field_0x20 & 0xf) != 0) {
              for (k = 0; k < (int)((*(uint *)&pCVar5->field_0x20 & 0xf) - 1); k = k + 1) {
                iVar3 = k;
                if (pCVar5->Store[k << 1] == pCVar5->Store[(k + 1) * 2]) {
                  do {
                    iVar1 = iVar3;
                    c = iVar1 + 1;
                    if ((int)(*(uint *)&pCVar5->field_0x20 & 0xf) <= c) break;
                    iVar3 = c;
                  } while (pCVar5->Store[k << 1] == pCVar5->Store[c * 2]);
                  if (pCVar5->Store[k << 1] == pCVar5->Store[k * 2 + 1]) {
                    p_00->nSymGroupsE[c - k] = p_00->nSymGroupsE[c - k] + 1;
                    k = iVar1;
                  }
                  else {
                    p_00->nSymGroups[c - k] = p_00->nSymGroups[c - k] + 1;
                    k = iVar1;
                  }
                }
              }
            }
          }
          else {
            Extra_MmFixedEntryRecycle(p_00->pMem,(char *)pCVar5);
          }
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void Cut_CellPrecompute()
{
    Cut_CMan_t * p;
    Cut_Cell_t * pCell, * pTemp;
    int i1, i2, i3, i, j, k, c;
    abctime clk = Abc_Clock(); //, clk2 = Abc_Clock();

    p = Cut_CManStart();

    // precompute truth tables
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[0], p->uInputs[1], p->uInputs[2], p->uTemp1[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[3], p->uInputs[4], p->uInputs[5], p->uTemp2[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[6], p->uInputs[7], p->uInputs[8], p->uTemp3[i], 9, i );
/*
        if ( k == 8 && ((i1 == 6 && i2 == 14 && i3 == 20) || (i1 == 20 && i2 == 6 && i3 == 14)) )
        {
            Extra_PrintBinary( stdout, &pCell->CanonPhase, pCell->nVars+1 ); printf( " : " );
            for ( i = 0; i < pCell->nVars; i++ )
                printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
            Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars );
            printf( "\n" );
        }
*/
/*
    // go through symmetric roots
    for ( k = 0; k < 5; k++ )
    for ( i1 =  0; i1 < 22; i1++ )
    for ( i2 = i1; i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3s[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3s[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through partially symmetric roots
    for ( k = 0; k < 4; k++ )
    for ( i1 = 0;  i1 < 22; i1++ )
    for ( i2 = 0;  i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3p[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3p[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through non-symmetric functions
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = 17;
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, 17 );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }
*/

    // go through non-symmetric functions
    for ( k = 0; k < 10; k++ )
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3[k] );
        // minimize the support
        Cut_CellSuppMin( pCell );

        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
        {
            p->nGood++;
            p->nVarCounts[pCell->nVars]++;

            if ( pCell->nVars )
            for ( i = 0; i < (int)pCell->nVars-1; i++ )
            {
                if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                    continue;
                // i and i+1 can be symmetric
                // find the end of this group
                for ( j = i+1; j < (int)pCell->nVars; j++ )
                    if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                        break;

                if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                    p->nSymGroupsE[j-i]++;
                else
                    p->nSymGroups[j-i]++;
                i = j - 1;
            }
/*
            if ( pCell->nVars == 3 )
            {
                Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                for ( i = 0; i < (int)pCell->nVars; i++ )
                    printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                printf( "\n" );
            }
*/
        }
    }

    printf( "BASIC: Total = %d. Good = %d. Entry = %d. ", (int)p->nTotal, (int)p->nGood, (int)sizeof(Cut_Cell_t) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    printf( "Cells:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nVarCounts[i] );
    printf( "\nDiffs:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroups[i] );
    printf( "\nEquals: " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroupsE[i] );
    printf( "\n" );

    // continue adding new cells using support
    for ( k = CUT_CELL_MVAR; k > 3; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        for ( i1 = 0; i1 < k; i1++ )
        for ( i2 = i1+1; i2 < k; i2++ )
        for ( c = 0; c < 3; c++ )
        {
            // derive the cell
            pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
            memset( pCell, 0, sizeof(Cut_Cell_t) );
            pCell->nVars   = pTemp->nVars;
            pCell->pParent = pTemp;
            // set the elementary permutation
            for ( i = 0; i < (int)pCell->nVars; i++ )
                pCell->CanonPerm[i] = i;
            // fill in the truth table
            Extra_TruthCopy( pCell->uTruth, pTemp->uTruth, pTemp->nVars );
            // create the cross-bar
            pCell->CrossBar0 = i1;
            pCell->CrossBar1 = i2;
            pCell->CrossBarPhase = c;
            Cut_CellCrossBar( pCell );
            // minimize the support
//clk2 = Abc_Clock();
            Cut_CellSuppMin( pCell );
//p->timeSupp += Abc_Clock() - clk2;
            // canonicize
//clk2 = Abc_Clock();
            pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
//p->timeCanon += Abc_Clock() - clk2;

            // add to the table
//clk2 = Abc_Clock();
            p->nTotal++;
            if ( Cut_CellTableLookup( p, pCell ) ) // already exists
                Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
            else
            {
                p->nGood++;
                p->nVarCounts[pCell->nVars]++;

                for ( i = 0; i < (int)pCell->nVars-1; i++ )
                {
                    if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                        continue;
                    // i and i+1 can be symmetric
                    // find the end of this group
                    for ( j = i+1; j < (int)pCell->nVars; j++ )
                        if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                            break;

                    if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                        p->nSymGroupsE[j-i]++;
                    else
                        p->nSymGroups[j-i]++;
                    i = j - 1;
                }
/*
                if ( pCell->nVars == 3 )
                {
                    Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                    for ( i = 0; i < (int)pCell->nVars; i++ )
                        printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                    printf( "\n" );
                }
*/
            }
//p->timeTable += Abc_Clock() - clk2;
        }

        printf( "VAR %d: Total = %d. Good = %d. Entry = %d. ", k, p->nTotal, p->nGood, (int)sizeof(Cut_Cell_t) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Cells:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nVarCounts[i] );
        printf( "\nDiffs:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroups[i] );
        printf( "\nEquals: " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroupsE[i] );
        printf( "\n" );
    }
//    printf( "\n" );
    ABC_PRT( "Supp ", p->timeSupp );
    ABC_PRT( "Canon", p->timeCanon );
    ABC_PRT( "Table", p->timeTable );
//    Cut_CManStop( p );
}